

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O1

Proto * LoadFunction(LoadState *S,TString *p)

{
  StkId *ppTVar1;
  unsigned_short *puVar2;
  lua_State *plVar3;
  StkId pTVar4;
  uint uVar5;
  int iVar6;
  GCObject *pt;
  TString *pTVar7;
  TValue *b;
  Table *pTVar8;
  Node *pNVar9;
  ulong uVar10;
  Proto *pPVar11;
  LocVar *pLVar12;
  TString **ppTVar13;
  long lVar14;
  char x_6;
  char x_4;
  char x;
  char x_1;
  char x_2;
  char x_3;
  lua_Number x_5;
  char local_3e;
  undefined1 local_3d;
  lu_byte local_3c;
  lu_byte local_3b;
  lu_byte local_3a;
  lu_byte local_39;
  undefined8 local_38;
  
  plVar3 = S->L;
  uVar5 = *(int *)&plVar3->nCcalls + 1;
  plVar3->nCcalls = (unsigned_short)uVar5;
  if (200 < (uVar5 & 0xffff)) {
    luaO_pushfstring(plVar3,"%s: %s in precompiled chunk",S->name,"code too deep");
    luaD_throw(S->L,3);
  }
  pt = (GCObject *)luaF_newproto(S->L);
  pTVar4 = S->L->top;
  (pTVar4->value).gc = pt;
  pTVar4->tt = 9;
  plVar3 = S->L;
  if ((long)plVar3->stack_last - (long)plVar3->top < 0x11) {
    luaD_growstack(plVar3,1);
  }
  ppTVar1 = &S->L->top;
  *ppTVar1 = *ppTVar1 + 1;
  pTVar7 = LoadString(S);
  if (pTVar7 != (TString *)0x0) {
    p = pTVar7;
  }
  (pt->p).source = p;
  iVar6 = LoadInt(S);
  (pt->p).linedefined = iVar6;
  iVar6 = LoadInt(S);
  (pt->p).lastlinedefined = iVar6;
  LoadBlock(S,&local_3c,1);
  (pt->p).nups = local_3c;
  LoadBlock(S,&local_3b,1);
  (pt->p).numparams = local_3b;
  LoadBlock(S,&local_3a,1);
  (pt->p).is_vararg = local_3a;
  LoadBlock(S,&local_39,1);
  (pt->p).maxstacksize = local_39;
  iVar6 = LoadInt(S);
  if (iVar6 < -1) {
    b = (TValue *)luaM_toobig(S->L);
  }
  else {
    b = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar6 * 4);
  }
  (pt->h).array = b;
  (pt->p).sizecode = iVar6;
  LoadBlock(S,b,(long)iVar6 << 2);
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pTVar8 = (Table *)luaM_toobig(S->L);
  }
  else {
    pTVar8 = (Table *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
  }
  (pt->h).metatable = pTVar8;
  (pt->p).sizek = uVar5;
  if (0 < (int)uVar5) {
    lVar14 = 0;
    do {
      *(undefined4 *)((long)&pTVar8->tt + lVar14) = 0;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar14);
  }
  if (0 < (int)uVar5) {
    lVar14 = 0;
    do {
      pTVar8 = (pt->h).metatable;
      LoadBlock(S,&local_3d,1);
      switch(local_3d) {
      case 0:
        *(undefined4 *)((long)&pTVar8->tt + lVar14) = 0;
        break;
      case 1:
        LoadBlock(S,&local_3e,1);
        *(uint *)((long)&pTVar8->next + lVar14) = (uint)(local_3e != '\0');
        *(undefined4 *)((long)&pTVar8->tt + lVar14) = 1;
        break;
      default:
        luaO_pushfstring(S->L,"%s: %s in precompiled chunk",S->name,"bad constant");
        luaD_throw(S->L,3);
        break;
      case 3:
        LoadBlock(S,&local_38,8);
        *(undefined8 *)((long)&pTVar8->next + lVar14) = local_38;
        *(undefined4 *)((long)&pTVar8->tt + lVar14) = 3;
        break;
      case 4:
        pTVar7 = LoadString(S);
        *(TString **)((long)&pTVar8->next + lVar14) = pTVar7;
        *(undefined4 *)((long)&pTVar8->tt + lVar14) = 4;
      }
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar14);
  }
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pNVar9 = (Node *)luaM_toobig(S->L);
  }
  else {
    pNVar9 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 3);
  }
  (pt->h).node = pNVar9;
  (pt->p).sizep = uVar5;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      (pt->p).p[uVar10] = (Proto *)0x0;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      pPVar11 = LoadFunction(S,(pt->p).source);
      (pt->p).p[uVar10] = pPVar11;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  iVar6 = LoadInt(S);
  if (iVar6 < -1) {
    pNVar9 = (Node *)luaM_toobig(S->L);
  }
  else {
    pNVar9 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar6 * 4);
  }
  (pt->h).lastfree = pNVar9;
  (pt->p).sizelineinfo = iVar6;
  LoadBlock(S,pNVar9,(long)iVar6 << 2);
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pLVar12 = (LocVar *)luaM_toobig(S->L);
  }
  else {
    pLVar12 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
  }
  (pt->p).locvars = pLVar12;
  (pt->p).sizelocvars = uVar5;
  if (0 < (int)uVar5) {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)&pLVar12->varname + lVar14) = 0;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar14);
    if (0 < (int)uVar5) {
      lVar14 = 0;
      do {
        pTVar7 = LoadString(S);
        *(TString **)((long)&((pt->p).locvars)->varname + lVar14) = pTVar7;
        iVar6 = LoadInt(S);
        *(int *)((long)&((pt->p).locvars)->startpc + lVar14) = iVar6;
        iVar6 = LoadInt(S);
        *(int *)((long)&((pt->p).locvars)->endpc + lVar14) = iVar6;
        lVar14 = lVar14 + 0x10;
      } while ((ulong)uVar5 << 4 != lVar14);
    }
  }
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    ppTVar13 = (TString **)luaM_toobig(S->L);
  }
  else {
    ppTVar13 = (TString **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 3);
  }
  (pt->p).upvalues = ppTVar13;
  (pt->p).sizeupvalues = uVar5;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      (pt->p).upvalues[uVar10] = (TString *)0x0;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    if (0 < (int)uVar5) {
      uVar10 = 0;
      do {
        pTVar7 = LoadString(S);
        (pt->p).upvalues[uVar10] = pTVar7;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
  }
  iVar6 = luaG_checkcode(&pt->p);
  if (iVar6 == 0) {
    luaO_pushfstring(S->L,"%s: %s in precompiled chunk",S->name,"bad code");
    luaD_throw(S->L,3);
  }
  plVar3 = S->L;
  ppTVar1 = &plVar3->top;
  *ppTVar1 = *ppTVar1 + -1;
  puVar2 = &plVar3->nCcalls;
  *puVar2 = *puVar2 - 1;
  return (Proto *)pt;
}

Assistant:

static Proto* LoadFunction(LoadState* S, TString* p)
{
 Proto* f;
 if (++S->L->nCcalls > LUAI_MAXCCALLS) error(S,"code too deep");
 f=luaF_newproto(S->L);
 setptvalue2s(S->L,S->L->top,f); incr_top(S->L);
 f->source=LoadString(S); if (f->source==NULL) f->source=p;
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->nups=LoadByte(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadDebug(S,f);
 IF (!luaG_checkcode(f), "bad code");
 S->L->top--;
 S->L->nCcalls--;
 return f;
}